

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

AMQP_VALUE amqpvalue_clone(AMQP_VALUE value)

{
  uint32_t *puVar1;
  LOGGER_LOG p_Var2;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_clone",0x8c6,1,"NULL value");
    }
  }
  else {
    puVar1 = &value[-1].value.binary_value.length;
    *puVar1 = *puVar1 + 1;
  }
  return value;
}

Assistant:

AMQP_VALUE amqpvalue_clone(AMQP_VALUE value)
{
    AMQP_VALUE result;

    if (value == NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_402: [ If `value` is NULL, `amqpvalue_clone` shall return NULL. ]*/
        LogError("NULL value");
        result = NULL;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_235: [amqpvalue_clone shall clone the value passed as argument and return a new non-NULL handle to the cloned AMQP value.] */
        INC_REF(AMQP_VALUE_DATA, value);
        result = value;
    }

    return result;
}